

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_access.h
# Opt level: O0

int __thiscall
Gudhi::persistence_matrix::
Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
::unlink(Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
         *this,char *__name)

{
  uint uVar1;
  Matrix_entry *entry_local;
  Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  *this_local;
  
  if (this->rows_ != (Row_container *)0x0) {
    uVar1 = boost::intrusive::
            generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag,_(boost::intrusive::link_mode_type)2,_(boost::intrusive::base_hook_type)1>
            ::unlink((generic_hook<(boost::intrusive::algo_types)0,_boost::intrusive::list_node_traits<void_*>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag,_(boost::intrusive::link_mode_type)2,_(boost::intrusive::base_hook_type)1>
                      *)(__name + 8),__name);
    this = (Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
            *)(ulong)uVar1;
  }
  return (int)this;
}

Assistant:

inline void Row_access<Master_matrix>::unlink(Matrix_entry* entry) 
{
  if (rows_ == nullptr) return;

  if constexpr (Master_matrix::Option_list::has_intrusive_rows) {
    entry->Base_hook_matrix_row::unlink();
  } else {
    if constexpr (Master_matrix::Option_list::has_removable_rows) {
      auto it = rows_->find(entry->get_row_index());
      it->second.erase(*entry);
    } else {
      rows_->operator[](entry->get_row_index()).erase(*entry);
    }
  }
}